

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,FuncDecl *node)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  pointer psVar5;
  
  psVar1 = (node->formalParameters).
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (node->formalParameters).
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (psVar5->super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (*(peVar2->super_Statement).super_ASTNode._vptr_ASTNode[2])(peVar2,this);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
  }
  peVar4 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*(peVar4->super_Statement).super_ASTNode._vptr_ASTNode[2])(peVar4,this);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

void operator()(ast::FuncDecl &node) const override {
    for (auto &param : node.formalParameters)
      visit(param);
    visit(node.body);
  }